

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2C02.h
# Opt level: O3

Sprite * __thiscall m2C02::GetPatternTable(m2C02 *this,uint8_t i,uint8_t palette)

{
  int iVar1;
  ushort addr;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  int iVar8;
  undefined7 in_register_00000031;
  int iVar9;
  int iVar10;
  Sprite *pSVar11;
  int local_74;
  int local_70;
  int local_6c;
  
  uVar7 = CONCAT71(in_register_00000031,i) & 0xffffffff;
  pSVar11 = (this->sprPatternTable)._M_elems + uVar7;
  local_74 = 0;
  iVar5 = 0;
  do {
    local_70 = 7;
    iVar6 = 0;
    do {
      iVar10 = 0;
      local_6c = local_74;
      do {
        addr = (short)iVar6 * 0x10 + (short)iVar5 * 0x100 +
               (short)CONCAT71(in_register_00000031,i) * 0x1000 + (short)iVar10;
        bVar2 = ppuRead(this,addr,false);
        bVar3 = ppuRead(this,addr | 8,false);
        iVar9 = 8;
        iVar8 = local_70;
        do {
          bVar4 = ppuRead(this,(ushort)(byte)((bVar3 & 1) + (bVar2 & 1)) |
                               (short)CONCAT71(in_register_00000011,palette) * 4 + 0x3f00U,false);
          iVar1 = pSVar11->width;
          if ((iVar8 < iVar1) &&
             (iVar5 * 8 + iVar10 < (this->sprPatternTable)._M_elems[uVar7].height)) {
            (this->sprPatternTable)._M_elems[uVar7].pColData[(uint)(iVar1 * local_6c + iVar8)].
            field_0 = *(anon_union_4_2_12391da5_for_Pixel_0 *)
                       (&(this->palScreen).field_0x0 + (ulong)(bVar4 & 0x3f) * 4);
          }
          bVar2 = bVar2 >> 1;
          bVar3 = bVar3 >> 1;
          iVar8 = iVar8 + -1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        iVar10 = iVar10 + 1;
        local_6c = local_6c + 1;
      } while (iVar10 != 8);
      iVar6 = iVar6 + 1;
      local_70 = local_70 + 8;
    } while (iVar6 != 0x10);
    iVar5 = iVar5 + 1;
    local_74 = local_74 + 8;
  } while (iVar5 != 0x10);
  return pSVar11;
}

Assistant:

olc::Sprite &GetPatternTable(uint8_t i, uint8_t palette)
  {
    for (uint16_t nTileY = 0; nTileY < 16; nTileY++)
    {
      for (uint16_t nTileX = 0; nTileX < 16; nTileX++)
      {
        uint16_t nOffset = nTileY * 256 + nTileX * 16;

        for (uint16_t row = 0; row < 8; row++)
        {
          uint8_t tileLsb = ppuRead(i * 0x1000u + nOffset + row + 0);
          uint8_t tileMsb = ppuRead(i * 0x1000u + nOffset + row + 8);

          for (uint16_t col = 0; col < 8; col++)
          {
            uint8_t pixel = (tileLsb & 0x01u) + (tileMsb & 0x01u);
            tileLsb >>= 1;
            tileMsb >>= 1;
            sprPatternTable[i].SetPixel(
                nTileX * 8 + (7 - col), nTileY * 8 + row,
                GetColourFromPaletteRam(palette, pixel));
          }
        }
      }
    }

    return sprPatternTable[i];
  }